

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O3

void vector_int(void)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> s;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  vector<int,_std::allocator<int>_> local_1c0;
  Assert local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  ostream local_188 [112];
  ios_base local_118 [272];
  
  local_198 = 0x100000000;
  uStack_190 = 0x9c00000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_198;
  std::vector<int,_std::allocator<int>_>::vector(&local_1c0,__l,(allocator_type *)&local_1e0);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_198);
  UnitTests::stream_any_details::output_range_or_type<std::vector<int,std::allocator<int>>>
            (local_188,&local_1c0,(true_type *)&local_1e0);
  local_1a8.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1a8.m_line = 0x62;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (&local_1a8,(char (*) [15])"[0, 1, 2, 156]",&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_198);
  std::ios_base::~ios_base(local_118);
  if (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(vector_int)
{
    auto s  = std::vector<int>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}